

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::ShaderSubroutine::NegativeTest4::iterate(NegativeTest4 *this)

{
  ostringstream *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  GLint GVar4;
  deUint32 dVar5;
  _test_case _Var6;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  _shader_stage *shader_stage;
  char *pcVar8;
  _test_case _Var9;
  GLint compile_status;
  char *body_raw_ptr;
  string body;
  _test_case local_214;
  int local_210;
  uint local_20c;
  long local_208;
  GLenum local_1fc;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  long lVar7;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  pcVar8 = "GL_ARB_shader_subroutine";
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar2) {
    this_00 = (ostringstream *)(local_1b0 + 8);
    _Var6 = TEST_CASE_FIRST;
    lVar1 = local_208;
    do {
      local_208 = lVar1;
      local_1b0._0_4_ = _Var6;
      local_1fc = Utils::getGLenumForShaderStage((_shader_stage *)local_1b0);
      local_20c = 1;
      local_208 = 1;
      do {
        _Var9 = TEST_CASE_FIRST;
        do {
          local_1f0 = &local_1e0;
          local_1e8 = 0;
          local_1e0 = 0;
          local_1f8 = (undefined1 *)0x0;
          local_210 = 0;
          local_214 = _Var9;
          local_1d0._M_dataplus._M_p._0_4_ = _Var6;
          getShaderBody_abi_cxx11_
                    ((string *)local_1b0,(NegativeTest4 *)pcVar8,(_shader_stage *)&local_1d0,
                     &local_20c,&local_214);
          std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._0_8_ != local_1a0) {
            operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
          }
          local_1f8 = local_1f0;
          GVar4 = (**(code **)(lVar7 + 0x3f0))(local_1fc);
          this->m_so_id = GVar4;
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glCreateShader() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x2eba);
          (**(code **)(lVar7 + 0x12b8))(this->m_so_id,1,&local_1f8,0);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glShaderSource() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x2ebd);
          (**(code **)(lVar7 + 0x248))(this->m_so_id);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glCompileShader() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x2ec0);
          (**(code **)(lVar7 + 0xa70))(this->m_so_id,0x8b81,&local_210);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glGetShaderiv() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x2ec3);
          if (local_210 == 1) {
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"A malformed ",0xc);
            local_214 = _Var6;
            Utils::getShaderStageString_abi_cxx11_(&local_1d0,(Utils *)&local_214,shader_stage);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,
                       (char *)CONCAT44(local_1d0._M_dataplus._M_p._4_4_,
                                        (_test_case)local_1d0._M_dataplus._M_p),
                       local_1d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00," compiled successfully (",0x18);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00," subroutine types were defined).",0x20);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_1d0._M_dataplus._M_p._4_4_,(_test_case)local_1d0._M_dataplus._M_p)
                != &local_1d0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_1d0._M_dataplus._M_p._4_4_,
                                       (_test_case)local_1d0._M_dataplus._M_p),
                              local_1d0.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            this->m_has_test_passed = false;
          }
          (**(code **)(lVar7 + 0x470))(this->m_so_id);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          pcVar8 = "glDeleteShader() call failed.";
          glu::checkError(dVar5,"glDeleteShader() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x2ed4);
          if (local_1f0 != &local_1e0) {
            pcVar8 = (char *)(CONCAT71(uStack_1df,local_1e0) + 1);
            operator_delete(local_1f0,(ulong)pcVar8);
          }
          _Var9 = _Var9 + TEST_CASE_INCOMPATIBLE_ARGUMENT_LIST;
        } while (_Var9 != TEST_CASE_COUNT);
        local_208 = local_208 + 1;
        local_20c = (uint)local_208;
      } while (local_208 != 6);
      _Var6 = _Var6 + TEST_CASE_INCOMPATIBLE_ARGUMENT_LIST;
      lVar1 = 6;
    } while (_Var6 != 5);
    bVar2 = this->m_has_test_passed == false;
    if (bVar2) {
      pcVar8 = "Fail";
    }
    else {
      pcVar8 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar2,pcVar8);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"GL_ARB_shader_subroutine is not supported.","");
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b0);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult NegativeTest4::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Iterate over all shader stages.. */
	for (int shader_stage = static_cast<int>(Utils::SHADER_STAGE_FIRST);
		 shader_stage != static_cast<int>(Utils::SHADER_STAGE_COUNT); ++shader_stage)
	{
		/* For each shader stage, we will be trying to compile a number of invalid shaders.
		 * Each shader defines N different subroutine types. (N-1) of them are compatible
		 * with a subroutine, but exactly 1 will be mismatched. The test passes if GLSL
		 * compiler correctly detects that all shaders we will be trying to compile are
		 * broken.
		 */
		const glw::GLenum shader_type = Utils::getGLenumForShaderStage(static_cast<Utils::_shader_stage>(shader_stage));

		for (unsigned int n_subroutine_types = 1; n_subroutine_types < 6; /* arbitrary number */
			 ++n_subroutine_types)
		{
			for (int test_case = static_cast<int>(TEST_CASE_FIRST); test_case != static_cast<int>(TEST_CASE_COUNT);
				 ++test_case)
			{
				std::string body;
				const char* body_raw_ptr   = NULL;
				glw::GLint  compile_status = GL_FALSE;

				body = getShaderBody(static_cast<Utils::_shader_stage>(shader_stage), n_subroutine_types,
									 static_cast<_test_case>(test_case));
				body_raw_ptr = body.c_str();

				/* Try to compile the shader */
				m_so_id = gl.createShader(shader_type);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

				gl.shaderSource(m_so_id, 1 /* count */, &body_raw_ptr, DE_NULL);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed");

				gl.compileShader(m_so_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed");

				gl.getShaderiv(m_so_id, GL_COMPILE_STATUS, &compile_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

				if (compile_status == GL_TRUE)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A malformed "
									   << Utils::getShaderStageString(static_cast<Utils::_shader_stage>(shader_stage))
									   << " compiled successfully "
										  "("
									   << n_subroutine_types << " subroutine types "
																"were defined)."
									   << tcu::TestLog::EndMessage;

					m_has_test_passed = false;
				}

				/* Release the object */
				gl.deleteShader(m_so_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed.");
			} /* for (all test cases) */
		}	 /* for (a number of different subroutine type declarations) */
	}		  /* for (all shader stages) */

	/* Done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}